

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O1

void __thiscall chrono::fea::ChMatterMeshless::ChMatterMeshless(ChMatterMeshless *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChContinuumPlasticVonMises *pCVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 auVar4 [32];
  undefined1 local_29;
  ChContinuumPlasticVonMises *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  ChObj::ChObj((ChObj *)this);
  auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChIndexedNodes).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = auVar4;
  (this->super_ChIndexedNodes).super_ChPhysicsItem.system = (ChSystem *)auVar4._0_8_;
  (this->super_ChIndexedNodes).super_ChPhysicsItem.vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar4._8_16_;
  (this->super_ChIndexedNodes).super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar4._24_8_;
  (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChMatterMeshless_00b4f680;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auVar4 = ZEXT1632(ZEXT816(0) << 0x40);
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 )auVar4._0_24_;
  (this->material).
  super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar4._24_8_;
  *(undefined1 (*) [32])
   ((long)&(this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = auVar4;
  local_28 = (ChContinuumPlasticVonMises *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChContinuumPlasticVonMises,std::allocator<chrono::fea::ChContinuumPlasticVonMises>>
            (&_Stack_20,&local_28,(allocator<chrono::fea::ChContinuumPlasticVonMises> *)&local_29);
  _Var3._M_pi = _Stack_20._M_pi;
  pCVar2 = local_28;
  local_28 = (ChContinuumPlasticVonMises *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->material).
           super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->material).
  super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &pCVar2->super_ChContinuumElastoplastic;
  (this->material).
  super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  local_28 = (ChContinuumPlasticVonMises *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChMaterialSurfaceNSC,std::allocator<chrono::ChMaterialSurfaceNSC>>
            (&_Stack_20,(ChMaterialSurfaceNSC **)&local_28,
             (allocator<chrono::ChMaterialSurfaceNSC> *)&local_29);
  _Var3._M_pi = _Stack_20._M_pi;
  pCVar2 = local_28;
  local_28 = (ChContinuumPlasticVonMises *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->matsurface).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pCVar2;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  return;
}

Assistant:

ChMatterMeshless::ChMatterMeshless() : viscosity(0), do_collide(false) {
    // Default: VonMises material
    material = chrono_types::make_shared<ChContinuumPlasticVonMises>();

    // Default: NSC material
    matsurface = chrono_types::make_shared<ChMaterialSurfaceNSC>();
}